

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiWindow::ImGuiWindow(ImGuiWindow *this,char *name)

{
  ImU32 IVar1;
  ImGuiID IVar2;
  char *pcVar3;
  ImDrawList *pIVar4;
  ImVec2 local_64;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImVec2 local_2c [2];
  char *local_18;
  char *name_local;
  ImGuiWindow *this_local;
  
  local_18 = name;
  name_local = (char *)this;
  ImVec2::ImVec2(&this->PosFloat);
  ImVec2::ImVec2(&this->Pos);
  ImVec2::ImVec2(&this->Size);
  ImVec2::ImVec2(&this->SizeFull);
  ImVec2::ImVec2(&this->SizeContents);
  ImVec2::ImVec2(&this->SizeContentsExplicit);
  ImRect::ImRect(&this->ContentsRegionRect);
  ImVec2::ImVec2(&this->WindowPadding);
  ImVec2::ImVec2(&this->Scroll);
  ImVec2::ImVec2(&this->ScrollTarget);
  ImVec2::ImVec2(&this->ScrollTargetCenterRatio);
  ImVec2::ImVec2(&this->ScrollbarSizes);
  ImGuiDrawContext::ImGuiDrawContext(&this->DC);
  ImVector<unsigned_int>::ImVector(&this->IDStack);
  ImRect::ImRect(&this->ClipRect);
  ImRect::ImRect(&this->WindowRectClipped);
  ImGuiSimpleColumns::ImGuiSimpleColumns(&this->MenuColumns);
  ImGuiStorage::ImGuiStorage(&this->StateStorage);
  pcVar3 = ImStrdup(local_18);
  this->Name = pcVar3;
  IVar1 = ImHash(local_18,0,0);
  this->ID = IVar1;
  ImVector<unsigned_int>::push_back(&this->IDStack,&this->ID);
  IVar2 = GetID(this,"#MOVE",(char *)0x0);
  this->MoveId = IVar2;
  this->Flags = 0;
  this->IndexWithinParent = 0;
  ImVec2::ImVec2(local_2c,0.0,0.0);
  this->Pos = local_2c[0];
  this->PosFloat = this->Pos;
  ImVec2::ImVec2(&local_34,0.0,0.0);
  this->SizeFull = local_34;
  this->Size = this->SizeFull;
  ImVec2::ImVec2(&local_3c,0.0,0.0);
  this->SizeContentsExplicit = local_3c;
  this->SizeContents = this->SizeContentsExplicit;
  ImVec2::ImVec2(&local_44,0.0,0.0);
  this->WindowPadding = local_44;
  ImVec2::ImVec2(&local_4c,0.0,0.0);
  this->Scroll = local_4c;
  ImVec2::ImVec2(&local_54,3.4028235e+38,3.4028235e+38);
  this->ScrollTarget = local_54;
  ImVec2::ImVec2(&local_5c,0.5,0.5);
  this->ScrollTargetCenterRatio = local_5c;
  this->ScrollbarY = false;
  this->ScrollbarX = false;
  ImVec2::ImVec2(&local_64,0.0,0.0);
  this->ScrollbarSizes = local_64;
  this->BorderSize = 0.0;
  this->WasActive = false;
  this->Active = false;
  this->Accessed = false;
  this->Collapsed = false;
  this->SkipItems = false;
  this->BeginCount = 0;
  this->PopupId = 0;
  this->AutoFitFramesY = -1;
  this->AutoFitFramesX = -1;
  this->AutoFitOnlyGrows = false;
  this->AutoPosLastDirection = -1;
  this->HiddenFrames = 0;
  this->SetWindowCollapsedAllowFlags = 0xf;
  this->SetWindowSizeAllowFlags = 0xf;
  this->SetWindowPosAllowFlags = 0xf;
  this->SetWindowPosCenterWanted = false;
  this->LastFrameActive = -1;
  this->ItemWidthDefault = 0.0;
  this->FontWindowScale = 1.0;
  pIVar4 = (ImDrawList *)ImGui::MemAlloc(0x98);
  this->DrawList = pIVar4;
  pIVar4 = (ImDrawList *)operator_new(0x98);
  ImDrawList::ImDrawList(pIVar4);
  this->DrawList->_OwnerName = this->Name;
  this->RootWindow = (ImGuiWindow *)0x0;
  this->RootNonPopupWindow = (ImGuiWindow *)0x0;
  this->ParentWindow = (ImGuiWindow *)0x0;
  this->FocusIdxTabCounter = -1;
  this->FocusIdxAllCounter = -1;
  this->FocusIdxTabRequestCurrent = 0x7fffffff;
  this->FocusIdxAllRequestCurrent = 0x7fffffff;
  this->FocusIdxTabRequestNext = 0x7fffffff;
  this->FocusIdxAllRequestNext = 0x7fffffff;
  return;
}

Assistant:

ImGuiWindow::ImGuiWindow(const char* name)
{
    Name = ImStrdup(name);
    ID = ImHash(name, 0);
    IDStack.push_back(ID);
    MoveId = GetID("#MOVE");

    Flags = 0;
    IndexWithinParent = 0;
    PosFloat = Pos = ImVec2(0.0f, 0.0f);
    Size = SizeFull = ImVec2(0.0f, 0.0f);
    SizeContents = SizeContentsExplicit = ImVec2(0.0f, 0.0f);
    WindowPadding = ImVec2(0.0f, 0.0f);
    Scroll = ImVec2(0.0f, 0.0f);
    ScrollTarget = ImVec2(FLT_MAX, FLT_MAX);
    ScrollTargetCenterRatio = ImVec2(0.5f, 0.5f);
    ScrollbarX = ScrollbarY = false;
    ScrollbarSizes = ImVec2(0.0f, 0.0f);
    BorderSize = 0.0f;
    Active = WasActive = false;
    Accessed = false;
    Collapsed = false;
    SkipItems = false;
    BeginCount = 0;
    PopupId = 0;
    AutoFitFramesX = AutoFitFramesY = -1;
    AutoFitOnlyGrows = false;
    AutoPosLastDirection = -1;
    HiddenFrames = 0;
    SetWindowPosAllowFlags = SetWindowSizeAllowFlags = SetWindowCollapsedAllowFlags = ImGuiSetCond_Always | ImGuiSetCond_Once | ImGuiSetCond_FirstUseEver | ImGuiSetCond_Appearing;
    SetWindowPosCenterWanted = false;

    LastFrameActive = -1;
    ItemWidthDefault = 0.0f;
    FontWindowScale = 1.0f;

    DrawList = (ImDrawList*)ImGui::MemAlloc(sizeof(ImDrawList));
    IM_PLACEMENT_NEW(DrawList) ImDrawList();
    DrawList->_OwnerName = Name;
    RootWindow = NULL;
    RootNonPopupWindow = NULL;
    ParentWindow = NULL;

    FocusIdxAllCounter = FocusIdxTabCounter = -1;
    FocusIdxAllRequestCurrent = FocusIdxTabRequestCurrent = INT_MAX;
    FocusIdxAllRequestNext = FocusIdxTabRequestNext = INT_MAX;
}